

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffc2r(char *cval,float *fval,int *status)

{
  int iVar1;
  char *outstr;
  float fVar2;
  char dtype;
  char msg [81];
  char sval [81];
  byte local_d9;
  char local_d8 [96];
  char local_78 [88];
  
  if (0 < *status) {
    return *status;
  }
  if (*cval == '\0') {
    *status = 0xcc;
    return 0xcc;
  }
  ffdtyp(cval,(char *)&local_d9,status);
  switch(local_d9) {
  case 0x43:
    outstr = local_78;
    ffc2s(cval,outstr,status);
    break;
  default:
    *status = 0x195;
    goto LAB_001510d6;
  case 0x46:
  case 0x49:
    outstr = cval;
    break;
  case 0x4c:
    fVar2 = 0.0;
    if ((*status < 1) && (*cval == 'T')) {
      fVar2 = 1.0;
    }
    *fval = fVar2;
    goto LAB_001510c8;
  }
  ffc2rr(outstr,fval,status);
LAB_001510c8:
  iVar1 = *status;
  if (0 < iVar1) {
LAB_001510d6:
    *fval = 0.0;
    builtin_strncpy(local_d8 + 0x20," as a float: ",0xe);
    builtin_strncpy(local_d8 + 0x10,"valuating string",0x10);
    builtin_strncpy(local_d8,"Error in ffc2r e",0x10);
    strncat(local_d8,cval,0x1e);
    ffxmsg(5,local_d8);
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffc2r(const char *cval,   /* I - string representation of the value */
          float *fval,        /* O - numerical value of the input string */
          int *status)        /* IO - error status */
/*
  convert formatted string to a real float value, doing implicit
  datatype conversion if necessary
*/
{
    char dtype, sval[81], msg[81];
    int lval;
    
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (cval[0] == '\0')
        return(*status = VALUE_UNDEFINED);  /* null value string */

    ffdtyp(cval, &dtype, status);     /* determine the datatype */

    if (dtype == 'I' || dtype == 'F')
        ffc2rr(cval, fval, status);
    else if (dtype == 'L')
    {
        ffc2ll(cval, &lval, status);
        *fval = (float) lval;
    }
    else if (dtype == 'C')
    {
        /* try reading the string as a number */
        ffc2s(cval, sval, status); 
        ffc2rr(sval, fval, status);
    }
    else 
        *status = BAD_FLOATKEY;

    if (*status > 0)
    {
            *fval = 0.;
            strcpy(msg,"Error in ffc2r evaluating string as a float: ");
            strncat(msg,cval,30);
            ffpmsg(msg);
            return(*status);
    }

    return(*status);
}